

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymObjBase::write_refs_to_obj_file(CTcSymObjBase *this,CVmFile *fp)

{
  tc_symtype_t tVar1;
  CTPNSuperclass *this_00;
  CTcSymObjBase *this_01;
  CTPNSuperclass *in_RSI;
  CTcSymObjBase *in_RDI;
  CTcSymObj *sym;
  CTcVocabEntry *voc;
  long end_pos;
  long cnt_pos;
  uint cnt;
  CTPNSuperclass *sc;
  CTPNSuperclass *in_stack_ffffffffffffff98;
  CVmFile *in_stack_ffffffffffffffa0;
  CTPNSuperclass *buf;
  CTcVocabEntry *local_40;
  CTPNSuperclass *local_20;
  int local_4;
  
  if ((*(ushort *)&in_RDI->field_0xb8 >> 6 & 1) == 0) {
    local_4 = 0;
  }
  else {
    buf = in_RSI;
    get_obj_file_idx(in_RDI);
    CVmFile::write_uint4(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20))
    ;
    CVmFile::get_pos(in_stack_ffffffffffffffa0);
    CVmFile::write_uint2(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20))
    ;
    if (in_RDI->obj_stm_ == (CTPNStmObject *)0x0) {
      this_00 = (CTPNSuperclass *)0x0;
      local_20 = this_00;
    }
    else {
      this_00 = CTPNObjDef::get_first_sc
                          (&(in_RDI->obj_stm_->super_CTPNStmObjectBase).super_CTPNObjDef);
      local_20 = this_00;
    }
    for (; local_20 != (CTPNSuperclass *)0x0; local_20 = local_20->nxt_) {
      this_01 = (CTcSymObjBase *)CTPNSuperclass::get_sym(in_stack_ffffffffffffff98);
      if ((this_01 != (CTcSymObjBase *)0x0) &&
         (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), tVar1 == TC_SYM_OBJ)) {
        in_stack_ffffffffffffff98 = in_RSI;
        get_obj_file_idx(this_01);
        CVmFile::write_uint4((CVmFile *)this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
    }
    CVmFile::get_pos((CVmFile *)this_00);
    CVmFile::set_pos((CVmFile *)this_00,(long)in_stack_ffffffffffffff98);
    CVmFile::write_uint2((CVmFile *)this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    CVmFile::set_pos((CVmFile *)this_00,(long)in_stack_ffffffffffffff98);
    for (local_40 = in_RDI->vocab_; local_40 != (CTcVocabEntry *)0x0; local_40 = local_40->nxt_) {
    }
    CVmFile::write_uint2((CVmFile *)this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    for (local_40 = in_RDI->vocab_; local_40 != (CTcVocabEntry *)0x0; local_40 = local_40->nxt_) {
      CVmFile::write_uint2((CVmFile *)this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      CVmFile::write_bytes((CVmFile *)in_RDI,(char *)buf,(size_t)this_00);
      CVmFile::write_uint2((CVmFile *)this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CTcSymObjBase::write_refs_to_obj_file(CVmFile *fp)
{
    CTPNSuperclass *sc;
    uint cnt;
    long cnt_pos;
    long end_pos;
    CTcVocabEntry *voc;

    /* 
     *   if this symbol wasn't written to the object file in the first place,
     *   we obviously don't want to include any extra data for it 
     */
    if (!written_to_obj_)
        return FALSE;

    /* write my symbol index */
    fp->write_uint4(get_obj_file_idx());

    /* write a placeholder superclass count */
    cnt_pos = fp->get_pos();
    fp->write_uint2(0);

    /* write my superclass list */
    for (sc = (obj_stm_ != 0 ? obj_stm_->get_first_sc() : 0), cnt = 0 ;
         sc != 0 ; sc = sc->nxt_)
    {
        CTcSymObj *sym;

        /* look up this superclass symbol */
        sym = (CTcSymObj *)sc->get_sym();
        if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
        {
            /* write the superclass symbol index */
            fp->write_uint4(sym->get_obj_file_idx());

            /* count it */
            ++cnt;
        }
    }

    /* go back and write the superclass count */
    end_pos = fp->get_pos();
    fp->set_pos(cnt_pos);
    fp->write_uint2(cnt);
    fp->set_pos(end_pos);

    /* count my vocabulary words */
    for (cnt = 0, voc = vocab_ ; voc != 0 ; ++cnt, voc = voc->nxt_) ;

    /* write my vocabulary words */
    fp->write_uint2(cnt);
    for (voc = vocab_ ; voc != 0 ; voc = voc->nxt_)
    {
        /* write the text of the word */
        fp->write_uint2(voc->len_);
        fp->write_bytes(voc->txt_, voc->len_);

        /* write the property ID */
        fp->write_uint2(voc->prop_);
    }

    /* indicate that we wrote the symbol */
    return TRUE;
}